

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool IR::Instr::HasSymUseSrc(StackSym *sym,Opnd *src)

{
  code *pcVar1;
  OpndKind OVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  ListOpndType *src_00;
  StackSym *pSVar6;
  PropertySymOpnd *this;
  int i;
  
  if (src != (Opnd *)0x0) {
    OVar2 = Opnd::GetKind(src);
    OVar3 = Opnd::GetKind(src);
    if (OVar2 == OpndKindReg) {
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_004b8c52;
        *puVar5 = 0;
      }
      pSVar6 = (StackSym *)src[1]._vptr_Opnd;
    }
    else {
      OVar2 = Opnd::GetKind(src);
      if (OVar3 != OpndKindIndir) {
        OVar3 = Opnd::GetKind(src);
        if (OVar2 != OpndKindList) {
          if (OVar3 != OpndKindSym) {
            return false;
          }
          OVar2 = Opnd::GetKind(src);
          if (OVar2 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar4) goto LAB_004b8c52;
            *puVar5 = 0;
          }
          pSVar6 = (StackSym *)Opnd::GetSym(src);
          if (pSVar6 == sym) {
            return true;
          }
          bVar4 = SymOpnd::IsPropertySymOpnd((SymOpnd *)src);
          if (!bVar4) {
            return false;
          }
          this = Opnd::AsPropertySymOpnd(src);
          pSVar6 = PropertySymOpnd::GetObjectSym(this);
          if (pSVar6 != sym) {
            return false;
          }
          return true;
        }
        if (OVar3 != OpndKindList) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
          if (!bVar4) {
LAB_004b8c52:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        if (*(int *)&src[1]._vptr_Opnd < 1) {
          return false;
        }
        i = 0;
        do {
          src_00 = ListOpnd::Item((ListOpnd *)src,i);
          bVar4 = HasSymUseSrc(sym,&src_00->super_Opnd);
          if (bVar4) {
            return true;
          }
          i = i + 1;
        } while (i < *(int *)&src[1]._vptr_Opnd);
        return false;
      }
      if (OVar2 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_004b8c52;
        *puVar5 = 0;
      }
      if ((src[1]._vptr_Opnd != (_func_int **)0x0) && ((StackSym *)src[1]._vptr_Opnd[2] == sym)) {
        return true;
      }
      if (*(long *)&src[1].m_valueType == 0) {
        return false;
      }
      pSVar6 = *(StackSym **)(*(long *)&src[1].m_valueType + 0x10);
    }
    if (pSVar6 == sym) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Instr::HasSymUseSrc(StackSym *sym, IR::Opnd* src)
{
    if (!src)
    {
        return false;
    }
    if (src->IsRegOpnd())
    {
        RegOpnd *regOpnd = src->AsRegOpnd();

        if (regOpnd->m_sym == sym)
        {
            return true;
        }
    }
    else if (src->IsIndirOpnd())
    {
        IR::IndirOpnd *indirOpnd = src->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        if (baseOpnd != nullptr && baseOpnd->m_sym == sym)
        {
            return true;
        }
        else if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == sym)
        {
            return true;
        }
    }
    else if (src->IsListOpnd())
    {
        IR::ListOpnd* list = src->AsListOpnd();
        for (int i = 0; i < list->Count(); ++i)
        {
            if (HasSymUseSrc(sym, list->Item(i)))
            {
                return true;
            }
        }
    }
    else if (src->IsSymOpnd())
    {
        SymOpnd* symOpnd = src->AsSymOpnd();
        if (symOpnd->GetSym() == sym)
        {
            return true;
        }
        if (symOpnd->IsPropertySymOpnd())
        {
            PropertySymOpnd* propertySymOpnd = symOpnd->AsPropertySymOpnd();
            if (propertySymOpnd->GetObjectSym() == sym)
            {
                return true;
            }
        }
    }
    return false;
}